

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfBufferInline.h
# Opt level: O0

sbfBuffer_conflict sbfBuffer_new(sbfPool pool,size_t size)

{
  sbfPool in_RSI;
  long in_RDI;
  sbfBuffer_conflict buffer;
  sbfBuffer_conflict local_18;
  
  if (in_RDI == 0) {
    local_18 = (sbfBuffer_conflict)sbfMemory_malloc(in_RSI + 1);
    local_18->mAllocated = 1;
  }
  else {
    local_18 = (sbfBuffer_conflict)sbfPool_get(in_RSI);
    local_18->mAllocated = 0;
  }
  local_18->mDestroyCb = (sbfBufferDestroyCb)0x0;
  local_18->mDestroyData = (void *)0x0;
  local_18->mDestroyClosure = (void *)0x0;
  local_18->mData = local_18 + 1;
  local_18->mSize = (size_t)in_RSI;
  sbfRefCount_init(&local_18->mRefCount,1);
  local_18->mLocked = 0;
  local_18->mOwner = (void *)0x0;
  return local_18;
}

Assistant:

static SBF_INLINE sbfBuffer
sbfBuffer_new (sbfPool pool, size_t size)
{
    sbfBuffer buffer;

    if (pool == NULL)
    {
#ifdef WIN32
        buffer = (sbfBuffer)LocalAlloc (0, (sizeof *buffer) + size);
#else
        buffer = (sbfBuffer)xmalloc ((sizeof *buffer) + size);
#endif
        buffer->mAllocated = 1;
    }
    else
    {
        buffer = (sbfBuffer)sbfPool_get (pool);
        buffer->mAllocated = 0;
    }

    buffer->mDestroyCb = NULL;
    buffer->mDestroyData = NULL;
    buffer->mDestroyClosure = NULL;

    buffer->mData = buffer + 1;
    buffer->mSize = size;

    sbfRefCount_init (&buffer->mRefCount, 1);
    buffer->mLocked = 0;

    buffer->mOwner = NULL;

    return buffer;
}